

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O3

bool __thiscall RenX::Core::initialize(Core *this)

{
  undefined1 *translationsFile;
  pointer pcVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  tuple<RenX::Server_*,_std::default_delete<RenX::Server>_> this_00;
  string *psVar6;
  char *pcVar7;
  sockaddr *__addr;
  pointer *__ptr;
  pointer pbVar8;
  undefined1 auVar9 [16];
  container_type server_entries;
  __uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_> local_58;
  FILE *local_50;
  container_type local_48;
  
  (**(code **)(*(long *)banDatabase + 0x20))();
  (**(code **)(*(long *)exemptionDatabase + 0x20))();
  (*(code *)**(undefined8 **)tags)();
  translationsFile = &this->field_0x38;
  initTranslations((Config *)translationsFile);
  auVar9 = Jupiter::Config::get(translationsFile,7,"Servers",0,0);
  uVar5 = Jupiter::Config::get(translationsFile,0xc,"CommandsFile",0x14,"RenXGameCommands.ini");
  Jupiter::Config::read(&this->m_commandsFile,uVar5);
  pcVar7 = " \t";
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_const_char_*,_const_char_*>
            (&local_48,auVar9._8_8_,auVar9._8_8_ + auVar9._0_8_," \t","");
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_48.
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
      super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>)operator_new(0x3f8)
      ;
      iVar3 = (int)pbVar8->_M_len;
      Server::Server((Server *)
                     this_00.
                     super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
                     super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl,*pbVar8);
      iVar3 = Server::connect((Server *)
                              this_00.
                              super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                              .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl,iVar3,
                              __addr,(socklen_t)pcVar7);
      if ((char)iVar3 == '\0') {
        local_50 = _stderr;
        psVar6 = Server::getHostname_abi_cxx11_
                           ((Server *)
                            this_00.
                            super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                            .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl);
        pcVar1 = (psVar6->_M_dataplus)._M_p;
        uVar2 = Server::getPort((Server *)
                                this_00.
                                super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                                .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl);
        uVar4 = Jupiter::Socket::getLastError();
        pcVar7 = (char *)(ulong)uVar2;
        fprintf(local_50,"[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d\r\n",
                pcVar1,pcVar7,(ulong)uVar4);
        (**(code **)(*(long *)this_00.
                              super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                              .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl + 0x10))
                  (this_00.
                   super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
                   super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl);
      }
      else {
        local_58._M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
        super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl =
             (tuple<RenX::Server_*,_std::default_delete<RenX::Server>_>)
             (tuple<RenX::Server_*,_std::default_delete<RenX::Server>_>)
             this_00.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
             super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl;
        std::
        vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>
        ::emplace_back<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>
                  ((vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>
                    *)&this->m_servers,
                   (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)&local_58);
        if ((_Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>)
            local_58._M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
            .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl != (Server *)0x0) {
          (**(code **)(*(long *)local_58._M_t.
                                super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                                .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl + 0x10))
                    ();
        }
        local_58._M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
        super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl =
             (tuple<RenX::Server_*,_std::default_delete<RenX::Server>_>)
             (_Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>)0x0;
      }
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_48.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_48.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool RenX::Core::initialize() {
	RenX::banDatabase->initialize();
	RenX::exemptionDatabase->initialize();
	RenX::tags->initialize();
	RenX::initTranslations(this->config);

	std::string_view serverList = this->config.get("Servers"sv);
	m_commandsFile.read(this->config.get("CommandsFile"sv, "RenXGameCommands.ini"sv));

	auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
	for (const auto& entry : server_entries) {
		auto server = std::make_unique<RenX::Server>(entry);

		if (server->connect() == false) {
			fprintf(stderr, "[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d" ENDL, server->getHostname().c_str(), server->getPort(), Jupiter::Socket::getLastError());
			continue;
		}

		addServer(std::move(server));
	}

	return true;
}